

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

bool __thiscall
tetgenmesh::lu_decmp(tetgenmesh *this,double (*lu) [4],int n,int *ps,double *d,int N)

{
  int iVar1;
  double dVar2;
  double dVar3;
  int local_98;
  int local_94;
  int k;
  int j;
  int i;
  int pivotindex;
  double tempf;
  double mult;
  double biggest;
  double pivot;
  double scales [4];
  int N_local;
  double *d_local;
  int *ps_local;
  int n_local;
  double (*lu_local) [4];
  tetgenmesh *this_local;
  
  j = 0;
  *d = 1.0;
  k = N;
  while( true ) {
    local_98 = N;
    if (n + N <= k) {
      while( true ) {
        if (n + N + -1 <= local_98) {
          return lu[ps[n + N + -1]][n + N + -1] != 0.0;
        }
        mult = 0.0;
        for (k = local_98; k < n + N; k = k + 1) {
          dVar2 = ABS(lu[ps[k]][local_98]) * scales[(long)ps[k] + -1];
          if (mult < dVar2) {
            j = k;
            mult = dVar2;
          }
        }
        if ((mult == 0.0) && (!NAN(mult))) break;
        if (j != local_98) {
          iVar1 = ps[local_98];
          ps[local_98] = ps[j];
          ps[j] = iVar1;
          *d = -*d;
        }
        dVar2 = lu[ps[local_98]][local_98];
        k = local_98;
        while (k = k + 1, k < n + N) {
          dVar3 = lu[ps[k]][local_98] / dVar2;
          lu[ps[k]][local_98] = dVar3;
          local_94 = local_98;
          if ((dVar3 != 0.0) || (NAN(dVar3))) {
            while (local_94 = local_94 + 1, local_94 < n + N) {
              lu[ps[k]][local_94] = -dVar3 * lu[ps[local_98]][local_94] + lu[ps[k]][local_94];
            }
          }
        }
        local_98 = local_98 + 1;
      }
      return false;
    }
    mult = 0.0;
    for (local_94 = N; local_94 < n + N; local_94 = local_94 + 1) {
      if (mult < ABS(lu[k][local_94])) {
        mult = ABS(lu[k][local_94]);
      }
    }
    if ((mult == 0.0) && (!NAN(mult))) break;
    scales[(long)k + -1] = 1.0 / mult;
    ps[k] = k;
    k = k + 1;
  }
  scales[(long)k + -1] = 0.0;
  return false;
}

Assistant:

bool tetgenmesh::lu_decmp(REAL lu[4][4], int n, int* ps, REAL* d, int N)
{
  REAL scales[4];
  REAL pivot, biggest, mult, tempf;
  int pivotindex = 0;
  int i, j, k;

  *d = 1.0;                                      // No row interchanges yet.

  for (i = N; i < n + N; i++) {                             // For each row.
    // Find the largest element in each row for row equilibration
    biggest = 0.0;
    for (j = N; j < n + N; j++)
      if (biggest < (tempf = fabs(lu[i][j])))
        biggest  = tempf;
    if (biggest != 0.0)
      scales[i] = 1.0 / biggest;
    else {
      scales[i] = 0.0;
      return false;                            // Zero row: singular matrix.
    }
    ps[i] = i;                                 // Initialize pivot sequence.
  }

  for (k = N; k < n + N - 1; k++) {                      // For each column.
    // Find the largest element in each column to pivot around.
    biggest = 0.0;
    for (i = k; i < n + N; i++) {
      if (biggest < (tempf = fabs(lu[ps[i]][k]) * scales[ps[i]])) {
        biggest = tempf;
        pivotindex = i;
      }
    }
    if (biggest == 0.0) {
      return false;                         // Zero column: singular matrix.
    }
    if (pivotindex != k) {                         // Update pivot sequence.
      j = ps[k];
      ps[k] = ps[pivotindex];
      ps[pivotindex] = j;
      *d = -(*d);                          // ...and change the parity of d.
    }

    // Pivot, eliminating an extra variable  each time
    pivot = lu[ps[k]][k];
    for (i = k + 1; i < n + N; i++) {
      lu[ps[i]][k] = mult = lu[ps[i]][k] / pivot;
      if (mult != 0.0) {
        for (j = k + 1; j < n + N; j++)
          lu[ps[i]][j] -= mult * lu[ps[k]][j];
      }
    }
  }

  // (lu[ps[n + N - 1]][n + N - 1] == 0.0) ==> A is singular.
  return lu[ps[n + N - 1]][n + N - 1] != 0.0;
}